

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O0

TSpirvInstruction * __thiscall
glslang::TParseContext::makeSpirvInstruction
          (TParseContext *this,TSourceLoc *loc,TString *name,TString *value)

{
  bool bVar1;
  TSpirvInstruction *this_00;
  char *pcVar2;
  TSpirvInstruction *spirvInst;
  TString *value_local;
  TString *name_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  this_00 = (TSpirvInstruction *)
            TSpirvInstruction::operator_new((TSpirvInstruction *)0x30,(size_t)loc);
  TSpirvInstruction::TSpirvInstruction(this_00);
  bVar1 = std::operator==(name,"set");
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)this_00,
              value);
  }
  else {
    pcVar2 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str(name)
    ;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"unknown SPIR-V instruction qualifier",pcVar2,"");
  }
  return this_00;
}

Assistant:

TSpirvInstruction* TParseContext::makeSpirvInstruction(const TSourceLoc& loc, const TString& name, const TString& value)
{
    TSpirvInstruction* spirvInst = new TSpirvInstruction;
    if (name == "set")
        spirvInst->set = value;
    else
        error(loc, "unknown SPIR-V instruction qualifier", name.c_str(), "");

    return spirvInst;
}